

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O3

bool __thiscall tl::CStrT<char>::operator==(CStrT<char> *this,CStrT<char> o)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  
  uVar1 = o._size;
  if (this->_size != uVar1) {
    return false;
  }
  if (uVar1 != 0) {
    lVar2 = 0;
    do {
      bVar3 = this->_str[lVar2] == o._str[lVar2];
      if (!bVar3) {
        return bVar3;
      }
      bVar4 = (ulong)uVar1 - 1 != lVar2;
      lVar2 = lVar2 + 1;
    } while (bVar4);
    return bVar3;
  }
  return true;
}

Assistant:

bool CStrT<CharT>::operator==(CStrT o)const
{
    if(_size != o._size)
        return false;
    for(u32 i=0; i<_size; i++) {
        if(_str[i] != o._str[i])
            return false;
    }
    return true;
}